

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  local_38;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  holder;
  ArgumentTuple tuple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  FunctionMocker<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  std::
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::tuple<true,_true>((tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                       *)&holder,args,args_1);
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<void>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
              *)&local_38,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
            ::operator->(&local_38);
  ActionResultHolder<void>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  ::~unique_ptr(&local_38);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }